

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::validate_module_capability(Impl *this,Capability cap)

{
  VkBool32 VVar1;
  uint uVar2;
  const_iterator cVar3;
  char *pcVar4;
  byte bVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  key_type local_70;
  key_type local_50;
  
  bVar7 = true;
  if (0x1390 < (int)cap) {
    if ((int)cap < 0x14d8) {
      if (0x1480 < (int)cap) {
        switch(cap) {
        case CapabilityFragmentFullyCoveredEXT:
          pcVar6 = "VK_EXT_conservative_rasterization";
          pcVar4 = "";
          goto LAB_00191ba2;
        case CapabilityMeshShadingNV:
          return (this->features).mesh_shader_nv.meshShader == 1;
        case CapabilityMeshShadingNV|CapabilityShader:
        case 0x1494:
        case 0x1495:
        case 0x1496:
        case 0x1497:
        case 0x1498:
        case 0x1499:
        case 0x149a:
        case 0x149b:
        case 0x149c:
        case 0x149d:
        case 0x149e:
        case 0x149f:
        case 0x14a0:
        case 0x14a1:
        case CapabilityFragmentBarycentricKHR|CapabilityShader:
        case CapabilityFragmentBarycentricKHR|CapabilityGeometry:
        case CapabilityFragmentBarycentricKHR|CapabilityTessellation:
        case CapabilityComputeDerivativeGroupQuadsKHR|CapabilityShader:
        case CapabilityComputeDerivativeGroupQuadsKHR|CapabilityGeometry:
        case CapabilityComputeDerivativeGroupQuadsKHR|Addresses:
        case CapabilityComputeDerivativeGroupQuadsKHR|CapabilityLinkage:
        case CapabilityComputeDerivativeGroupQuadsKHR|CapabilityKernel:
        case CapabilityComputeDerivativeGroupQuadsKHR|CapabilityVector16:
        case 0x14b0:
        case 0x14b2:
        case 0x14b3:
        case 0x14b4:
          goto switchD_00190f96_caseD_4;
        case CapabilityImageFootprintNV:
          return (this->features).image_footprint_nv.imageFootprint == 1;
        case CapabilityMeshShadingEXT:
          return (this->features).mesh_shader.meshShader == 1;
        case CapabilityFragmentBarycentricKHR:
          return (this->features).barycentric.fragmentShaderBarycentric == 1;
        case CapabilityComputeDerivativeGroupQuadsKHR:
          return (this->features).compute_shader_derivatives.computeDerivativeGroupQuads == 1;
        case CapabilityFragmentDensityEXT:
          bVar7 = (this->features).shading_rate_nv.shadingRateImage == 1;
          bVar8 = (this->features).fragment_density.fragmentDensityMap == 1;
          goto LAB_00191a1e;
        case CapabilityGroupNonUniformPartitionedNV:
          bVar5 = *(byte *)((long)&(this->props).subgroup.supportedOperations + 1);
          goto LAB_00191a96;
        case CapabilityShaderNonUniform:
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"VK_EXT_descriptor_indexing","");
          cVar3 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,&local_70);
          uVar2 = this->api_version;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          return cVar3.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur != (__node_type *)0x0 || 0x401fff < uVar2;
        case CapabilityRuntimeDescriptorArray:
          return (this->features).descriptor_indexing.runtimeDescriptorArray == 1;
        case CapabilityInputAttachmentArrayDynamicIndexing:
          return (this->features).descriptor_indexing.shaderInputAttachmentArrayDynamicIndexing == 1
          ;
        case CapabilityUniformTexelBufferArrayDynamicIndexing:
          return (this->features).descriptor_indexing.shaderUniformTexelBufferArrayDynamicIndexing
                 == 1;
        case CapabilityStorageTexelBufferArrayDynamicIndexing:
          return (this->features).descriptor_indexing.shaderStorageTexelBufferArrayDynamicIndexing
                 == 1;
        case CapabilityUniformBufferArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.shaderUniformBufferArrayNonUniformIndexing ==
                 1;
        case CapabilitySampledImageArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.shaderSampledImageArrayNonUniformIndexing == 1
          ;
        case CapabilityStorageBufferArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.shaderStorageBufferArrayNonUniformIndexing ==
                 1;
        case CapabilityStorageImageArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.shaderStorageImageArrayNonUniformIndexing == 1
          ;
        case CapabilityInputAttachmentArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexing
                 == 1;
        case CapabilityUniformTexelBufferArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.
                 shaderUniformTexelBufferArrayNonUniformIndexing == 1;
        case CapabilityStorageTexelBufferArrayNonUniformIndexing:
          return (this->features).descriptor_indexing.
                 shaderStorageTexelBufferArrayNonUniformIndexing == 1;
        }
        switch(cap) {
        case CapabilitySampleMaskOverrideCoverageNV:
          pcVar6 = "VK_NV_sample_mask_override_coverage";
          pcVar4 = "";
          break;
        default:
          goto switchD_00190f96_caseD_4;
        case CapabilityGeometryShaderPassthroughNV:
          pcVar6 = "VK_NV_geometry_shader_passthrough";
          pcVar4 = "";
          break;
        case CapabilityShaderViewportIndexLayerEXT:
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"VK_EXT_shader_viewport_index_layer","");
          cVar3 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,&local_70);
          bVar7 = true;
          if (cVar3.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"VK_NV_viewport_array2","");
            cVar3 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,&local_50);
            bVar7 = cVar3.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur != (__node_type *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_00191bc3;
        case CapabilityShaderViewportMaskNV:
          pcVar6 = "VK_NV_viewport_array2";
          pcVar4 = "";
          break;
        case CapabilityPerViewAttributesNV:
          pcVar6 = "VK_NVX_multiview_per_view_attributes";
          pcVar4 = "";
        }
        goto LAB_00191ba2;
      }
      switch(cap) {
      case CapabilityImageGatherBiasLodAMD:
        pcVar6 = "VK_AMD_texture_gather_bias_lod";
        pcVar4 = "";
        break;
      case CapabilityFragmentMaskAMD:
        pcVar6 = "VK_AMD_shader_fragment_mask";
        pcVar4 = "";
        break;
      case CapabilityStencilExportEXT:
        pcVar6 = "VK_EXT_shader_stencil_export";
        pcVar4 = "";
        break;
      case CapabilityImageReadWriteLodAMD:
        pcVar6 = "VK_AMD_shader_image_load_store_lod";
        pcVar4 = "";
        break;
      case CapabilityInt64ImageEXT:
        goto switchD_001910ca_caseD_1398;
      default:
        if (cap == CapabilityShaderClockKHR) {
          return (this->features).shader_clock.shaderSubgroupClock == 1 &&
                 (this->features).shader_clock.shaderDeviceClock == 1;
        }
        if (cap == CapabilityQuadControlKHR) {
          return (this->features).shader_quad_control.shaderQuadControl == 1;
        }
      case CapabilityFragmentMaskAMD|CapabilityShader:
      case CapabilityFloat16ImageAMD|Addresses:
      case CapabilityFloat16ImageAMD|CapabilityKernel:
switchD_00190f96_caseD_4:
        validate_module_capability();
        return false;
      }
    }
    else {
      if (0x15cf < (int)cap) {
        if ((int)cap < 0x15fd) {
          if ((int)cap < 0x15ed) {
            if (cap == CapabilityIntegerFunctions2INTEL) {
              return (this->features).integer_functions2_intel.shaderIntegerFunctions2 == 1;
            }
            if (cap != AtomicFloat32MinMaxEXT) goto switchD_00190f96_caseD_4;
            bVar7 = (this->features).shader_atomic_float2.shaderBufferFloat32AtomicMinMax == 1;
            bVar8 = (this->features).shader_atomic_float2.shaderSharedFloat32AtomicMinMax == 1;
          }
          else if (cap == AtomicFloat64MinMaxEXT) {
            bVar7 = (this->features).shader_atomic_float2.shaderBufferFloat64AtomicMinMax == 1;
            bVar8 = (this->features).shader_atomic_float2.shaderSharedFloat64AtomicMinMax == 1;
          }
          else {
            if (cap != AtomicFloat16MinMaxEXT) goto switchD_00190f96_caseD_4;
            bVar7 = (this->features).shader_atomic_float2.shaderBufferFloat16AtomicMinMax == 1;
            bVar8 = (this->features).shader_atomic_float2.shaderSharedFloat16AtomicMinMax == 1;
          }
LAB_00191a1e:
          return (bool)(bVar8 | bVar7);
        }
        switch(cap) {
        case CapabilityDotProductInputAll:
        case CapabilityDotProductInput4x8Bit:
        case CapabilityDotProductInput4x8BitPacked:
        case CapabilityDotProduct:
          return (this->features).shader_integer_dot_product.shaderIntegerDotProduct == 1;
        case CapabilityRayCullMaskKHR:
          return (this->features).ray_tracing_maintenance1.rayTracingMaintenance1 == 1;
        case CapabilityRayCullMaskKHR|CapabilityShader:
        case CapabilityCooperativeMatrixKHR|CapabilityShader:
        case BitInstructions:
        case CapabilityGroupNonUniformRotateKHR|CapabilityShader:
        case CapabilityReplicatedCompositesEXT|Addresses:
        case CapabilityReplicatedCompositesEXT|CapabilityKernel:
        case CapabilityReplicatedCompositesEXT|CapabilityVector16:
        case 0x1790:
          break;
        case CapabilityCooperativeMatrixKHR:
          return (this->features).cooperative_matrix.cooperativeMatrix == 1;
        case CapabilityReplicatedCompositesEXT:
          return (this->features).shader_replicated_composites.shaderReplicatedComposites == 1;
        case CapabilityGroupNonUniformRotateKHR:
          return (this->features).shader_subgroup_rotate.shaderSubgroupRotate == 1;
        case CapabilityFloatControls2:
          return (this->features).shader_float_controls2.shaderFloatControls2 == 1;
        case AtomicFloat32AddEXT:
          if ((this->features).shader_atomic_float.shaderBufferFloat32AtomicAdd == 1) {
            return true;
          }
          if ((this->features).shader_atomic_float.shaderSharedFloat32AtomicAdd == 1) {
            return true;
          }
          return (this->features).shader_atomic_float.shaderImageFloat32AtomicAdd == 1;
        case AtomicFloat64AddEXT:
          bVar7 = (this->features).shader_atomic_float.shaderBufferFloat64AtomicAdd == 1;
          bVar8 = (this->features).shader_atomic_float.shaderSharedFloat64AtomicAdd == 1;
          goto LAB_00191a1e;
        default:
          if (cap == CapabilityExpectAssumeKHR) {
            return (this->features).expect_assume.shaderExpectAssume == 1;
          }
          if (cap == AtomicFloat16AddEXT) {
            bVar7 = (this->features).shader_atomic_float2.shaderBufferFloat16AtomicAdd == 1;
            bVar8 = (this->features).shader_atomic_float2.shaderSharedFloat16AtomicAdd == 1;
            goto LAB_00191a1e;
          }
        }
        goto switchD_00190f96_caseD_4;
      }
      if ((int)cap < 0x14fc) {
        switch(cap) {
        case CapabilityRayTracingPositionFetchKHR:
switchD_00190fe6_caseD_14d8:
          return (this->features).ray_tracing_position_fetch.rayTracingPositionFetch == 1;
        case CapabilityRayTracingPositionFetchKHR|CapabilityShader:
        case CapabilityRayTracingPositionFetchKHR|CapabilityGeometry:
        case CapabilityRayTracingPositionFetchKHR|CapabilityTessellation:
        case CapabilityRayTracingNV|CapabilityGeometry:
        case CapabilityRayTracingNV|CapabilityTessellation:
        case CapabilityStorageTexelBufferArrayNonUniformIndexing|CapabilityClipDistance:
        case CapabilityStorageTexelBufferArrayNonUniformIndexing|CapabilityImageRect:
        case CapabilityStorageTexelBufferArrayNonUniformIndexing|CapabilitySampledRect:
          break;
        case CapabilityRayTracingNV:
          pcVar6 = "VK_NV_ray_tracing";
          pcVar4 = "";
          goto LAB_00191ba2;
        case CapabilityRayTracingMotionBlurNV:
          return (this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur == 1;
        case CapabilityVulkanMemoryModel:
          return (this->features).memory_model.vulkanMemoryModel == 1;
        case CapabilityVulkanMemoryModelDeviceScope:
          return (this->features).memory_model.vulkanMemoryModelDeviceScope == 1;
        case CapabilityPhysicalStorageBufferAddresses:
          bVar7 = (this->features).buffer_device_address.bufferDeviceAddress == 1;
          bVar8 = (this->features).buffer_device_address_ext.bufferDeviceAddress == 1;
          goto LAB_00191a1e;
        case CapabilityComputeDerivativeGroupLinearKHR:
          return (this->features).compute_shader_derivatives.computeDerivativeGroupLinear == 1;
        default:
          if (cap == CapabilityCooperativeMatrixNV) {
            return (this->features).cooperative_matrix_nv.cooperativeMatrix == 1;
          }
          if (cap == CapabilityFragmentShaderSampleInterlockEXT) {
            return (this->features).shader_interlock.fragmentShaderSampleInterlock == 1;
          }
        }
        goto switchD_00190f96_caseD_4;
      }
      switch(cap) {
      case CapabilityFragmentShaderShadingRateInterlockEXT:
        bVar7 = (this->features).shader_interlock.fragmentShaderShadingRateInterlock == 1;
        bVar8 = (this->features).shading_rate_nv.shadingRateImage == 1;
        goto LAB_00191a1e;
      case CapabilityShaderSMBuiltinsNV:
        return (this->features).sm_builtins_nv.shaderSMBuiltins == 1;
      case CapabilityFragmentShaderShadingRateInterlockEXT|CapabilityGeometry:
      case CapabilityFragmentShaderShadingRateInterlockEXT|CapabilityTessellation:
      case 0x1500:
      case 0x1501:
      case CapabilityDisplacementMicromapNV:
      case CapabilityDisplacementMicromapNV|CapabilityGeometry:
        goto switchD_00190f96_caseD_4;
      case CapabilityFragmentShaderPixelInterlockEXT:
        return (this->features).shader_interlock.fragmentShaderPixelInterlock == 1;
      case CapabilityDemoteToHelperInvocation:
        return (this->features).demote_to_helper.shaderDemoteToHelperInvocation == 1;
      case CapabilityRayTracingOpacityMicromapEXT:
        pcVar6 = "VK_EXT_opacity_micromap";
        pcVar4 = "";
        break;
      case CapabilityShaderInvocationReorderNV:
        pcVar6 = "VK_NV_ray_tracing_invocation_reorder";
        pcVar4 = "";
        break;
      default:
        if (cap == CapabilityRayQueryPositionFetchKHR) goto switchD_00190fe6_caseD_14d8;
        if (cap == CapabilityRawAccessChainsNV) {
          return (this->features).raw_access_chains_nv.shaderRawAccessChains == 1;
        }
        goto switchD_00190f96_caseD_4;
      }
    }
    goto LAB_00191ba2;
  }
  switch(cap) {
  case CapabilityMatrix:
  case CapabilityShader:
  case CapabilityInputAttachment:
  case CapabilitySampled1D:
  case CapabilityImage1D:
  case CapabilitySampledBuffer:
  case CapabilityImageBuffer:
  case CapabilityStorageImageExtendedFormats:
  case CapabilityImageQuery:
  case CapabilityDerivativeControl:
    break;
  case CapabilityGeometry:
    bVar7 = (this->features2).features.geometryShader == 1;
    break;
  case CapabilityTessellation:
    bVar7 = (this->features2).features.tessellationShader == 1;
    break;
  case Addresses:
  case CapabilityLinkage:
  case CapabilityKernel:
  case CapabilityVector16:
  case CapabilityFloat16Buffer:
  case CapabilityImageBasic:
  case CapabilityImageReadWrite:
  case CapabilityImageMipmap:
  case 0x10:
  case CapabilityPipes:
  case CapabilityDeviceEnqueue:
  case CapabilityLiteralSampler:
  case AtomicStorage:
  case CapabilityGeometryPointSize|CapabilityGeometry:
  case CapabilityImageRect:
  case CapabilitySampledRect:
  case CapabilityGenericPointer:
  case CapabilitySubgroupDispatch:
  case CapabilityNamedBarrier:
  case CapabilityPipeStorage:
    goto switchD_00190f96_caseD_4;
  case CapabilityFloat16:
    if ((this->features).float16_int8.shaderFloat16 == 1) {
      return true;
    }
    pcVar6 = "VK_AMD_gpu_shader_half_float";
    pcVar4 = "";
    goto LAB_00191ba2;
  case CapabilityFloat64:
    bVar7 = (this->features2).features.shaderFloat64 == 1;
    break;
  case CapabilityInt64:
    bVar7 = (this->features2).features.shaderInt64 == 1;
    break;
  case CapabilityInt64Atomics:
    if ((this->features).atomic_int64.shaderBufferInt64Atomics == 1) {
      return true;
    }
    if ((this->features).atomic_int64.shaderSharedInt64Atomics == 1) {
      return true;
    }
switchD_001910ca_caseD_1398:
    bVar7 = (this->features).shader_image_atomic_int64.shaderImageInt64Atomics == 1;
    break;
  case CapabilityGroups:
    pcVar6 = "VK_AMD_shader_ballot";
    pcVar4 = "";
    goto LAB_00191ba2;
  case CapabilityInt16:
    bVar7 = (this->features2).features.shaderInt16 == 1;
    break;
  case CapabilityTessellationPointSize:
  case CapabilityGeometryPointSize:
    bVar7 = (this->features2).features.shaderTessellationAndGeometryPointSize == 1;
    break;
  case CapabilityImageGatherExtended:
    bVar7 = (this->features2).features.shaderImageGatherExtended == 1;
    break;
  case CapabilityStorageImageMultisample:
  case CapabilityImageMSArray:
    bVar7 = (this->features2).features.shaderStorageImageMultisample == 1;
    break;
  case CapabilityUniformBufferArrayDynamicIndexing:
    bVar7 = (this->features2).features.shaderUniformBufferArrayDynamicIndexing == 1;
    break;
  case CapabilitySampledImageArrayDynamicIndexing:
    bVar7 = (this->features2).features.shaderSampledImageArrayDynamicIndexing == 1;
    break;
  case CapabilityStorageBufferArrayDynamicIndexing:
    bVar7 = (this->features2).features.shaderStorageBufferArrayDynamicIndexing == 1;
    break;
  case CapabilityStorageImageArrayDynamicIndexing:
    bVar7 = (this->features2).features.shaderStorageImageArrayDynamicIndexing == 1;
    break;
  case CapabilityClipDistance:
    bVar7 = (this->features2).features.shaderClipDistance == 1;
    break;
  case CapabilityCullDistance:
    bVar7 = (this->features2).features.shaderCullDistance == 1;
    break;
  case CapabilityImageCubeArray:
  case CapabilitySampledCubeArray:
    bVar7 = (this->features2).features.imageCubeArray == 1;
    break;
  case CapabilitySampleRateShading:
  case CapabilityInterpolationFunction:
    bVar7 = (this->features2).features.sampleRateShading == 1;
    break;
  case CapabilityInt8:
    bVar7 = (this->features).float16_int8.shaderInt8 == 1;
    break;
  case CapabilitySparseResidency:
    bVar7 = (this->features2).features.shaderResourceResidency == 1;
    break;
  case CapabilityMinLod:
    bVar7 = (this->features2).features.shaderResourceMinLod == 1;
    break;
  case CapabilityTransformFeedback:
    bVar7 = (this->features).transform_feedback.transformFeedback == 1;
    break;
  case CapabilityGeometryStreams:
    bVar7 = (this->features).transform_feedback.geometryStreams == 1;
    break;
  case CapabilityStorageImageReadWithoutFormat:
    VVar1 = (this->features2).features.shaderStorageImageReadWithoutFormat;
    goto joined_r0x001914ff;
  case CapabilityStorageImageWriteWithoutFormat:
    VVar1 = (this->features2).features.shaderStorageImageWriteWithoutFormat;
joined_r0x001914ff:
    if (VVar1 == 1) {
      return true;
    }
    if (0x402fff < this->api_version) {
      return true;
    }
    pcVar6 = "VK_KHR_format_feature_flags2";
    pcVar4 = "";
    goto LAB_00191ba2;
  case CapabilityMultiViewport:
    bVar7 = (this->features2).features.multiViewport == 1;
    break;
  case CapabilityGroupNonUniform:
    bVar5 = (byte)(this->props).subgroup.supportedOperations;
LAB_00191a96:
    bVar7 = (bool)(bVar5 & 1);
    break;
  case CapabilityGroupNonUniformVote:
    bVar7 = (bool)(((byte)(this->props).subgroup.supportedOperations & 2) >> 1);
    break;
  case CapabilityGroupNonUniformArithmetic:
    bVar7 = (bool)(((byte)(this->props).subgroup.supportedOperations & 4) >> 2);
    break;
  case CapabilityGroupNonUniformBallot:
    bVar7 = (bool)(((byte)(this->props).subgroup.supportedOperations & 8) >> 3);
    break;
  case CapabilityGroupNonUniformShuffle:
    bVar7 = (bool)(((byte)(this->props).subgroup.supportedOperations & 0x10) >> 4);
    break;
  case CapabilityGroupNonUniformShuffleRelative:
    bVar7 = (bool)(((byte)(this->props).subgroup.supportedOperations & 0x20) >> 5);
    break;
  case CapabilityGroupNonUniformClustered:
    bVar7 = (bool)(((byte)(this->props).subgroup.supportedOperations & 0x40) >> 6);
    break;
  case CapabilityGroupNonUniformQuad:
    bVar7 = (bool)((byte)(this->props).subgroup.supportedOperations >> 7);
    break;
  case CapabilityShaderLayer:
    VVar1 = (this->features).vk12.shaderOutputLayer;
    goto joined_r0x00191555;
  case CapabilityShaderViewportIndex:
    VVar1 = (this->features).vk12.shaderOutputViewportIndex;
joined_r0x00191555:
    if (VVar1 != 0) {
      return true;
    }
    pcVar6 = "VK_EXT_shader_viewport_index_layer";
    pcVar4 = "";
LAB_00191ba2:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar4);
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,&local_70);
    bVar7 = cVar3.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0;
LAB_00191bc3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    break;
  default:
    switch(cap) {
    case CapabilityFragmentShadingRateKHR:
      bVar7 = (this->features).fragment_shading_rate.primitiveFragmentShadingRate == 1;
      break;
    case CapabilitySubgroupBallotKHR:
      pcVar6 = "VK_EXT_shader_subgroup_ballot";
      pcVar4 = "";
      goto LAB_00191ba2;
    case 0x1148:
    case 0x1149:
    case 0x114a:
    case 0x1150:
    case CapabilityStorageInputOutput16|CapabilityGeometry:
    case 0x1158:
    case CapabilityVariablePointers|CapabilityShader:
    case 0x115c:
    case AtomicStorageOps:
    case 0x115e:
    case CapabilityStoragePushConstant8|CapabilityShader:
    case CapabilityStorageBuffer8BitAccess|Addresses:
    case CapabilityStorageBuffer8BitAccess|CapabilityLinkage:
    case CapabilityStorageBuffer8BitAccess|CapabilityKernel:
    case CapabilityStorageBuffer8BitAccess|CapabilityVector16:
    case CapabilityStorageBuffer8BitAccess|CapabilityFloat16Buffer:
    case CapabilityStorageBuffer8BitAccess|CapabilityFloat16:
    case CapabilityStorageBuffer8BitAccess|CapabilityFloat64:
    case CapabilityStorageBuffer8BitAccess|CapabilityInt64:
    case CapabilityStorageBuffer8BitAccess|CapabilityInt64Atomics:
    case CapabilityStorageBuffer8BitAccess|CapabilityImageBasic:
    case CapabilityStorageBuffer8BitAccess|CapabilityImageReadWrite:
    case CapabilityStorageBuffer8BitAccess|CapabilityImageMipmap:
    case CapabilityRoundingModeRTZ|CapabilityShader:
    case CapabilityRoundingModeRTZ|CapabilityGeometry:
    case CapabilityRayQueryProvisionalKHR:
    case CapabilityUntypedPointersKHR:
    case CapabilityRayQueryKHR|CapabilityGeometry:
    case CapabilityRayQueryKHR|CapabilityTessellation:
    case CapabilityRayQueryKHR|Addresses:
    case CapabilityRayQueryKHR|CapabilityLinkage:
    case 0x1180:
    case 0x1181:
    case 0x1182:
    case 0x1183:
    case CapabilityTextureBlockMatchQCOM|CapabilityShader:
    case 0x1188:
    case 0x1189:
    case 0x118a:
    case 0x118b:
    case 0x118c:
    case 0x118d:
    case 0x118e:
    case 0x118f:
    case 0x1190:
    case 0x1191:
      goto switchD_00190f96_caseD_4;
    case CapabilityDrawParameters:
      bVar7 = (this->features).draw_parameters.shaderDrawParameters == 1;
      break;
    case CapabilityWorkgroupMemoryExplicitLayoutKHR:
      bVar7 = (this->features).workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout == 1;
      break;
    case CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR:
      bVar7 = (this->features).workgroup_memory_explicit_layout.
              workgroupMemoryExplicitLayout8BitAccess == 1;
      break;
    case CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR:
      bVar7 = (this->features).workgroup_memory_explicit_layout.
              workgroupMemoryExplicitLayout16BitAccess == 1;
      break;
    case CapabilitySubgroupVoteKHR:
      pcVar6 = "VK_EXT_shader_subgroup_vote";
      pcVar4 = "";
      goto LAB_00191ba2;
    case CapabilityStorageBuffer16BitAccess:
      bVar7 = (this->features).storage_16bit.storageBuffer16BitAccess == 1;
      break;
    case CapabilityStorageUniform16:
      bVar7 = (this->features).storage_16bit.uniformAndStorageBuffer16BitAccess == 1;
      break;
    case CapabilityStoragePushConstant16:
      bVar7 = (this->features).storage_16bit.storagePushConstant16 == 1;
      break;
    case CapabilityStorageInputOutput16:
      bVar7 = (this->features).storage_16bit.storageInputOutput16 == 1;
      break;
    case CapabilityDeviceGroup:
      bVar7 = 0x400fff < this->api_version;
      break;
    case CapabilityMultiView:
      bVar7 = (this->features).multiview.multiview == 1;
      break;
    case CapabilityVariablePointersStorageBuffer:
      bVar7 = (this->features).variable_pointers.variablePointersStorageBuffer == 1;
      break;
    case CapabilityVariablePointers:
      bVar7 = (this->features).variable_pointers.variablePointers == 1;
      break;
    case CapabilitySampleMaskPostDepthCoverage:
      pcVar6 = "VK_EXT_post_depth_coverage";
      pcVar4 = "";
      goto LAB_00191ba2;
    case CapabilityStorageBuffer8BitAccess:
      bVar7 = (this->features).storage_8bit.storageBuffer8BitAccess == 1;
      break;
    case CapabilityUniformAndStorageBuffer8BitAccess:
      bVar7 = (this->features).storage_8bit.uniformAndStorageBuffer8BitAccess == 1;
      break;
    case CapabilityStoragePushConstant8:
      bVar7 = (this->features).storage_8bit.storagePushConstant8 == 1;
      break;
    case CapabilityDenormPreserve:
      if (((this->props).float_control.shaderDenormPreserveFloat16 != 1) &&
         ((this->props).float_control.shaderDenormPreserveFloat32 != 1)) {
        bVar7 = (this->props).float_control.shaderDenormPreserveFloat64 == 1;
      }
      break;
    case CapabilityDenormFlushToZero:
      if (((this->props).float_control.shaderDenormFlushToZeroFloat16 != 1) &&
         ((this->props).float_control.shaderDenormFlushToZeroFloat32 != 1)) {
        bVar7 = (this->props).float_control.shaderDenormFlushToZeroFloat64 == 1;
      }
      break;
    case CapabilitySignedZeroInfNanPreserve:
      if (((this->props).float_control.shaderSignedZeroInfNanPreserveFloat16 != 1) &&
         ((this->props).float_control.shaderSignedZeroInfNanPreserveFloat32 != 1)) {
        bVar7 = (this->props).float_control.shaderSignedZeroInfNanPreserveFloat64 == 1;
      }
      break;
    case CapabilityRoundingModeRTE:
      if (((this->props).float_control.shaderRoundingModeRTEFloat16 != 1) &&
         ((this->props).float_control.shaderRoundingModeRTEFloat32 != 1)) {
        bVar7 = (this->props).float_control.shaderRoundingModeRTEFloat64 == 1;
      }
      break;
    case CapabilityRoundingModeRTZ:
      if (((this->props).float_control.shaderRoundingModeRTZFloat16 != 1) &&
         ((this->props).float_control.shaderRoundingModeRTZFloat32 != 1)) {
        bVar7 = (this->props).float_control.shaderRoundingModeRTZFloat64 == 1;
      }
      break;
    case CapabilityRayQueryKHR:
      bVar7 = (this->features).ray_query.rayQuery == 1;
      break;
    case CapabilityRayTraversalPrimitiveCullingKHR:
      bVar7 = (this->features).ray_tracing_pipeline.rayTraversalPrimitiveCulling == 1;
      bVar8 = (this->features).ray_query.rayQuery == 1;
      goto LAB_00191a1e;
    case CapabilityRayTracingKHR:
      bVar7 = (this->features).ray_tracing_pipeline.rayTracingPipeline == 1;
      break;
    case CapabilityTextureSampleWeightedQCOM:
      bVar7 = (this->features).image_processing_qcom.textureSampleWeighted == 1;
      break;
    case CapabilityTextureBoxFilterQCOM:
      bVar7 = (this->features).image_processing_qcom.textureBoxFilter == 1;
      break;
    case CapabilityTextureBlockMatchQCOM:
      bVar7 = (this->features).image_processing_qcom.textureBlockMatch == 1;
      break;
    case CapabilityTextureBlockMatch2QCOM:
      bVar7 = (this->features).image_processing2_qcom.textureBlockMatch2 == 1;
      break;
    default:
      switch(cap) {
      case CapabilityCoreBuiltinsARM:
        bVar7 = (this->features).shader_core_builtins_arm.shaderCoreBuiltins == 1;
        break;
      case CapabilityTileImageColorReadAccessEXT:
        bVar7 = (this->features).shader_tile_image.shaderTileImageColorReadAccess == 1;
        break;
      case CapabilityTileImageDepthReadAccessEXT:
        bVar7 = (this->features).shader_tile_image.shaderTileImageDepthReadAccess == 1;
        break;
      case CapabilityTileImageStencilReadAccessEXT:
        bVar7 = (this->features).shader_tile_image.shaderTileImageStencilReadAccess == 1;
        break;
      default:
        goto switchD_00190f96_caseD_4;
      }
    }
  }
  return bVar7;
}

Assistant:

bool FeatureFilter::Impl::validate_module_capability(spv::Capability cap) const
{
	// From table 75 in Vulkan spec.

	switch (cap)
	{
	case spv::CapabilityMatrix:
	case spv::CapabilityShader:
	case spv::CapabilityInputAttachment:
	case spv::CapabilitySampled1D:
	case spv::CapabilityImage1D:
	case spv::CapabilitySampledBuffer:
	case spv::CapabilityImageBuffer:
	case spv::CapabilityImageQuery:
	case spv::CapabilityDerivativeControl:
	case spv::CapabilityStorageImageExtendedFormats:
		return true;

	case spv::CapabilityDeviceGroup:
		return api_version >= VK_API_VERSION_1_1;

	case spv::CapabilityGeometry:
		return features2.features.geometryShader == VK_TRUE;
	case spv::CapabilityTessellation:
		return features2.features.tessellationShader == VK_TRUE;
	case spv::CapabilityFloat64:
		return features2.features.shaderFloat64 == VK_TRUE;
	case spv::CapabilityInt64:
		return features2.features.shaderInt64 == VK_TRUE;
	case spv::CapabilityInt64Atomics:
		return features.atomic_int64.shaderBufferInt64Atomics == VK_TRUE ||
		       features.atomic_int64.shaderSharedInt64Atomics == VK_TRUE ||
		       features.shader_image_atomic_int64.shaderImageInt64Atomics == VK_TRUE;
	case spv::CapabilityAtomicFloat16AddEXT:
		return features.shader_atomic_float2.shaderBufferFloat16AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat16AtomicAdd == VK_TRUE;
	case spv::CapabilityAtomicFloat32AddEXT:
		return features.shader_atomic_float.shaderBufferFloat32AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float.shaderSharedFloat32AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float.shaderImageFloat32AtomicAdd == VK_TRUE;
	case spv::CapabilityAtomicFloat64AddEXT:
		return features.shader_atomic_float.shaderBufferFloat64AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float.shaderSharedFloat64AtomicAdd == VK_TRUE;
	case spv::CapabilityAtomicFloat16MinMaxEXT:
		return features.shader_atomic_float2.shaderBufferFloat16AtomicMinMax == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat16AtomicMinMax == VK_TRUE;
	case spv::CapabilityAtomicFloat32MinMaxEXT:
		return features.shader_atomic_float2.shaderBufferFloat32AtomicMinMax == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat32AtomicMinMax == VK_TRUE;
	case spv::CapabilityAtomicFloat64MinMaxEXT:
		return features.shader_atomic_float2.shaderBufferFloat64AtomicMinMax == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat64AtomicMinMax == VK_TRUE;
	case spv::CapabilityInt64ImageEXT:
		return features.shader_image_atomic_int64.shaderImageInt64Atomics == VK_TRUE;
	case spv::CapabilityGroups:
		return enabled_extensions.count(VK_AMD_SHADER_BALLOT_EXTENSION_NAME);
	case spv::CapabilityInt16:
		return features2.features.shaderInt16 == VK_TRUE;
	case spv::CapabilityTessellationPointSize:
	case spv::CapabilityGeometryPointSize:
		return features2.features.shaderTessellationAndGeometryPointSize == VK_TRUE;
	case spv::CapabilityImageGatherExtended:
		return features2.features.shaderImageGatherExtended == VK_TRUE;
	case spv::CapabilityStorageImageMultisample:
		return features2.features.shaderStorageImageMultisample == VK_TRUE;
	case spv::CapabilityUniformBufferArrayDynamicIndexing:
		return features2.features.shaderUniformBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilitySampledImageArrayDynamicIndexing:
		return features2.features.shaderSampledImageArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityStorageBufferArrayDynamicIndexing:
		return features2.features.shaderStorageBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityStorageImageArrayDynamicIndexing:
		return features2.features.shaderStorageImageArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityClipDistance:
		return features2.features.shaderClipDistance == VK_TRUE;
	case spv::CapabilityCullDistance:
		return features2.features.shaderCullDistance == VK_TRUE;
	case spv::CapabilityImageCubeArray:
		return features2.features.imageCubeArray == VK_TRUE;
	case spv::CapabilitySampleRateShading:
		return features2.features.sampleRateShading == VK_TRUE;
	case spv::CapabilitySparseResidency:
		return features2.features.shaderResourceResidency == VK_TRUE;
	case spv::CapabilityMinLod:
		return features2.features.shaderResourceMinLod == VK_TRUE;
	case spv::CapabilitySampledCubeArray:
		return features2.features.imageCubeArray == VK_TRUE;
	case spv::CapabilityImageMSArray:
		return features2.features.shaderStorageImageMultisample == VK_TRUE;
	case spv::CapabilityInterpolationFunction:
		return features2.features.sampleRateShading == VK_TRUE;
	case spv::CapabilityStorageImageReadWithoutFormat:
		return features2.features.shaderStorageImageReadWithoutFormat == VK_TRUE ||
		       api_version >= VK_API_VERSION_1_3 ||
		       enabled_extensions.count(VK_KHR_FORMAT_FEATURE_FLAGS_2_EXTENSION_NAME) != 0;
	case spv::CapabilityStorageImageWriteWithoutFormat:
		return features2.features.shaderStorageImageWriteWithoutFormat == VK_TRUE ||
		       api_version >= VK_API_VERSION_1_3 ||
		       enabled_extensions.count(VK_KHR_FORMAT_FEATURE_FLAGS_2_EXTENSION_NAME) != 0;
	case spv::CapabilityMultiViewport:
		return features2.features.multiViewport == VK_TRUE;
	case spv::CapabilityDrawParameters:
		return features.draw_parameters.shaderDrawParameters == VK_TRUE;
	case spv::CapabilityMultiView:
		return features.multiview.multiview == VK_TRUE;
	case spv::CapabilityVariablePointersStorageBuffer:
		return features.variable_pointers.variablePointersStorageBuffer == VK_TRUE;
	case spv::CapabilityVariablePointers:
		return features.variable_pointers.variablePointers == VK_TRUE;
	case spv::CapabilityShaderClockKHR:
		// There aren't two separate capabilities, so we'd have to analyze all opcodes to deduce this.
		// Just gate this on both feature bits being supported to be safe.
		return features.shader_clock.shaderDeviceClock == VK_TRUE &&
		       features.shader_clock.shaderSubgroupClock == VK_TRUE;
	case spv::CapabilityStencilExportEXT:
		return enabled_extensions.count(VK_EXT_SHADER_STENCIL_EXPORT_EXTENSION_NAME) != 0;
	case spv::CapabilitySubgroupBallotKHR:
		return enabled_extensions.count(VK_EXT_SHADER_SUBGROUP_BALLOT_EXTENSION_NAME) != 0;
	case spv::CapabilitySubgroupVoteKHR:
		return enabled_extensions.count(VK_EXT_SHADER_SUBGROUP_VOTE_EXTENSION_NAME) != 0;
	case spv::CapabilityImageReadWriteLodAMD:
		return enabled_extensions.count(VK_AMD_SHADER_IMAGE_LOAD_STORE_LOD_EXTENSION_NAME) != 0;
	case spv::CapabilityImageGatherBiasLodAMD:
		return enabled_extensions.count(VK_AMD_TEXTURE_GATHER_BIAS_LOD_EXTENSION_NAME) != 0;
	case spv::CapabilityFragmentMaskAMD:
		return enabled_extensions.count(VK_AMD_SHADER_FRAGMENT_MASK_EXTENSION_NAME) != 0;
	case spv::CapabilitySampleMaskOverrideCoverageNV:
		return enabled_extensions.count(VK_NV_SAMPLE_MASK_OVERRIDE_COVERAGE_EXTENSION_NAME) != 0;
	case spv::CapabilityGeometryShaderPassthroughNV:
		return enabled_extensions.count(VK_NV_GEOMETRY_SHADER_PASSTHROUGH_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderViewportIndex:
		return features.vk12.shaderOutputViewportIndex || enabled_extensions.count(VK_EXT_SHADER_VIEWPORT_INDEX_LAYER_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderLayer:
		return features.vk12.shaderOutputLayer || enabled_extensions.count(VK_EXT_SHADER_VIEWPORT_INDEX_LAYER_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderViewportIndexLayerEXT:
		// NV version is a cloned enum.
		return enabled_extensions.count(VK_EXT_SHADER_VIEWPORT_INDEX_LAYER_EXTENSION_NAME) != 0 ||
		       enabled_extensions.count(VK_NV_VIEWPORT_ARRAY2_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderViewportMaskNV:
		return enabled_extensions.count(VK_NV_VIEWPORT_ARRAY2_EXTENSION_NAME) != 0;
	case spv::CapabilityPerViewAttributesNV:
		return enabled_extensions.count(VK_NVX_MULTIVIEW_PER_VIEW_ATTRIBUTES_EXTENSION_NAME) != 0;
	case spv::CapabilityStorageBuffer16BitAccess:
		return features.storage_16bit.storageBuffer16BitAccess == VK_TRUE;
	case spv::CapabilityUniformAndStorageBuffer16BitAccess:
		return features.storage_16bit.uniformAndStorageBuffer16BitAccess == VK_TRUE;
	case spv::CapabilityStoragePushConstant16:
		return features.storage_16bit.storagePushConstant16 == VK_TRUE;
	case spv::CapabilityStorageInputOutput16:
		return features.storage_16bit.storageInputOutput16 == VK_TRUE;
	case spv::CapabilityGroupNonUniform:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_BASIC_BIT) != 0;
	case spv::CapabilityGroupNonUniformVote:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_VOTE_BIT) != 0;
	case spv::CapabilityGroupNonUniformArithmetic:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_ARITHMETIC_BIT) != 0;
	case spv::CapabilityGroupNonUniformBallot:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_BALLOT_BIT) != 0;
	case spv::CapabilityGroupNonUniformShuffle:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_SHUFFLE_BIT) != 0;
	case spv::CapabilityGroupNonUniformShuffleRelative:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_SHUFFLE_RELATIVE_BIT) != 0;
	case spv::CapabilityGroupNonUniformClustered:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_CLUSTERED_BIT) != 0;
	case spv::CapabilityGroupNonUniformQuad:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_QUAD_BIT) != 0;
	case spv::CapabilityGroupNonUniformPartitionedNV:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_PARTITIONED_BIT_NV) != 0;
	case spv::CapabilitySampleMaskPostDepthCoverage:
		return enabled_extensions.count(VK_EXT_POST_DEPTH_COVERAGE_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderNonUniform:
		return enabled_extensions.count(VK_EXT_DESCRIPTOR_INDEXING_EXTENSION_NAME) != 0 || api_version >= VK_API_VERSION_1_2;
	case spv::CapabilityRuntimeDescriptorArray:
		return features.descriptor_indexing.runtimeDescriptorArray == VK_TRUE;
	case spv::CapabilityInputAttachmentArrayDynamicIndexing:
		return features.descriptor_indexing.shaderInputAttachmentArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityUniformTexelBufferArrayDynamicIndexing:
		return features.descriptor_indexing.shaderUniformTexelBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityStorageTexelBufferArrayDynamicIndexing:
		return features.descriptor_indexing.shaderStorageTexelBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityUniformBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderUniformBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilitySampledImageArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderSampledImageArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityUniformTexelBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderUniformTexelBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityStorageBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderStorageBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityStorageImageArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderStorageImageArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityInputAttachmentArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityStorageTexelBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderStorageTexelBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityFloat16:
		return features.float16_int8.shaderFloat16 == VK_TRUE || enabled_extensions.count(VK_AMD_GPU_SHADER_HALF_FLOAT_EXTENSION_NAME) != 0;
	case spv::CapabilityInt8:
		return features.float16_int8.shaderInt8 == VK_TRUE;
	case spv::CapabilityStorageBuffer8BitAccess:
		return features.storage_8bit.storageBuffer8BitAccess == VK_TRUE;
	case spv::CapabilityUniformAndStorageBuffer8BitAccess:
		return features.storage_8bit.uniformAndStorageBuffer8BitAccess == VK_TRUE;
	case spv::CapabilityStoragePushConstant8:
		return features.storage_8bit.storagePushConstant8 == VK_TRUE;
	case spv::CapabilityVulkanMemoryModel:
		return features.memory_model.vulkanMemoryModel == VK_TRUE;
	case spv::CapabilityVulkanMemoryModelDeviceScope:
		return features.memory_model.vulkanMemoryModelDeviceScope == VK_TRUE;
	case spv::CapabilityDenormPreserve:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderDenormPreserveFloat16 == VK_TRUE ||
		       props.float_control.shaderDenormPreserveFloat32 == VK_TRUE ||
		       props.float_control.shaderDenormPreserveFloat64 == VK_TRUE;
	case spv::CapabilityDenormFlushToZero:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderDenormFlushToZeroFloat16 == VK_TRUE ||
		       props.float_control.shaderDenormFlushToZeroFloat32 == VK_TRUE ||
		       props.float_control.shaderDenormFlushToZeroFloat64 == VK_TRUE;
	case spv::CapabilitySignedZeroInfNanPreserve:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderSignedZeroInfNanPreserveFloat16 == VK_TRUE ||
		       props.float_control.shaderSignedZeroInfNanPreserveFloat32 == VK_TRUE ||
		       props.float_control.shaderSignedZeroInfNanPreserveFloat64 == VK_TRUE;
	case spv::CapabilityRoundingModeRTE:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderRoundingModeRTEFloat16 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTEFloat32 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTEFloat64 == VK_TRUE;
	case spv::CapabilityRoundingModeRTZ:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderRoundingModeRTZFloat16 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTZFloat32 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTZFloat64 == VK_TRUE;
	case spv::CapabilityComputeDerivativeGroupQuadsKHR:
		return features.compute_shader_derivatives.computeDerivativeGroupQuads == VK_TRUE;
	case spv::CapabilityComputeDerivativeGroupLinearKHR:
		return features.compute_shader_derivatives.computeDerivativeGroupLinear == VK_TRUE;
	case spv::CapabilityFragmentBarycentricKHR:
		return features.barycentric.fragmentShaderBarycentric == VK_TRUE;
	case spv::CapabilityImageFootprintNV:
		return features.image_footprint_nv.imageFootprint == VK_TRUE;
	case spv::CapabilityFragmentDensityEXT:
		// Spec mentions ShadingRateImageNV, but that does not appear to exist?
		return features.shading_rate_nv.shadingRateImage == VK_TRUE ||
		       features.fragment_density.fragmentDensityMap == VK_TRUE;
	case spv::CapabilityMeshShadingNV:
		return features.mesh_shader_nv.meshShader == VK_TRUE;
	case spv::CapabilityRayTracingNV:
		return enabled_extensions.count(VK_NV_RAY_TRACING_EXTENSION_NAME) != 0;
	case spv::CapabilityTransformFeedback:
		return features.transform_feedback.transformFeedback == VK_TRUE;
	case spv::CapabilityGeometryStreams:
		return features.transform_feedback.geometryStreams == VK_TRUE;
	case spv::CapabilityPhysicalStorageBufferAddresses:
		// Apparently these are different types?
		return features.buffer_device_address.bufferDeviceAddress == VK_TRUE ||
		       features.buffer_device_address_ext.bufferDeviceAddress == VK_TRUE;
	case spv::CapabilityCooperativeMatrixNV:
		return features.cooperative_matrix_nv.cooperativeMatrix == VK_TRUE;
	case spv::CapabilityIntegerFunctions2INTEL:
		return features.integer_functions2_intel.shaderIntegerFunctions2 == VK_TRUE;
	case spv::CapabilityShaderSMBuiltinsNV:
		return features.sm_builtins_nv.shaderSMBuiltins == VK_TRUE;
	case spv::CapabilityFragmentShaderSampleInterlockEXT:
		return features.shader_interlock.fragmentShaderSampleInterlock == VK_TRUE;
	case spv::CapabilityFragmentShaderPixelInterlockEXT:
		return features.shader_interlock.fragmentShaderPixelInterlock == VK_TRUE;
	case spv::CapabilityFragmentShaderShadingRateInterlockEXT:
		return features.shader_interlock.fragmentShaderShadingRateInterlock == VK_TRUE ||
		       features.shading_rate_nv.shadingRateImage == VK_TRUE;
	case spv::CapabilityDemoteToHelperInvocation:
		return features.demote_to_helper.shaderDemoteToHelperInvocation == VK_TRUE;
	case spv::CapabilityFragmentShadingRateKHR:
		return features.fragment_shading_rate.primitiveFragmentShadingRate == VK_TRUE;
	case spv::CapabilityRayQueryKHR:
		return features.ray_query.rayQuery == VK_TRUE;
	case spv::CapabilityRayTracingKHR:
		return features.ray_tracing_pipeline.rayTracingPipeline == VK_TRUE;
	case spv::CapabilityRayTraversalPrimitiveCullingKHR:
		return features.ray_tracing_pipeline.rayTraversalPrimitiveCulling == VK_TRUE ||
		       features.ray_query.rayQuery == VK_TRUE;
	case spv::CapabilityWorkgroupMemoryExplicitLayoutKHR:
		return features.workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout == VK_TRUE;
	case spv::CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR:
		return features.workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout8BitAccess == VK_TRUE;
	case spv::CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR:
		return features.workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout16BitAccess == VK_TRUE;
	case spv::CapabilityDotProduct:
	case spv::CapabilityDotProductInputAll:
	case spv::CapabilityDotProductInput4x8Bit:
	case spv::CapabilityDotProductInput4x8BitPacked:
		return features.shader_integer_dot_product.shaderIntegerDotProduct == VK_TRUE;
	case spv::CapabilityMeshShadingEXT:
		return features.mesh_shader.meshShader == VK_TRUE;
	case spv::CapabilityFragmentFullyCoveredEXT:
		return enabled_extensions.count(VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME) != 0;
	// AtomicFloat16VectorNV does not seem to exist.
	case spv::CapabilityRayCullMaskKHR:
		return features.ray_tracing_maintenance1.rayTracingMaintenance1 == VK_TRUE;
	case spv::CapabilityRayTracingMotionBlurNV:
		return features.ray_tracing_motion_blur_nv.rayTracingMotionBlur == VK_TRUE;
	case spv::CapabilityRayTracingOpacityMicromapEXT:
		return enabled_extensions.count(VK_EXT_OPACITY_MICROMAP_EXTENSION_NAME) != 0;
	case spv::CapabilityTextureSampleWeightedQCOM:
		return features.image_processing_qcom.textureSampleWeighted == VK_TRUE;
	case spv::CapabilityTextureBoxFilterQCOM:
		return features.image_processing_qcom.textureBoxFilter == VK_TRUE;
	case spv::CapabilityTextureBlockMatchQCOM:
		return features.image_processing_qcom.textureBlockMatch == VK_TRUE;
	case spv::CapabilityTextureBlockMatch2QCOM:
		return features.image_processing2_qcom.textureBlockMatch2 == VK_TRUE;
	case spv::CapabilityCoreBuiltinsARM:
		return features.shader_core_builtins_arm.shaderCoreBuiltins == VK_TRUE;
	case spv::CapabilityShaderInvocationReorderNV:
		return enabled_extensions.count(VK_NV_RAY_TRACING_INVOCATION_REORDER_EXTENSION_NAME) != 0;
	// Ignore CapabilityClusterCullingShadingHUAWEI. It does not exist in SPIR-V headers.
	case spv::CapabilityRayTracingPositionFetchKHR:
	case spv::CapabilityRayQueryPositionFetchKHR:
		return features.ray_tracing_position_fetch.rayTracingPositionFetch == VK_TRUE;
	case spv::CapabilityTileImageColorReadAccessEXT:
		return features.shader_tile_image.shaderTileImageColorReadAccess == VK_TRUE;
	case spv::CapabilityTileImageDepthReadAccessEXT:
		return features.shader_tile_image.shaderTileImageDepthReadAccess == VK_TRUE;
	case spv::CapabilityTileImageStencilReadAccessEXT:
		return features.shader_tile_image.shaderTileImageStencilReadAccess == VK_TRUE;
	case spv::CapabilityCooperativeMatrixKHR:
		return features.cooperative_matrix.cooperativeMatrix == VK_TRUE;
	// Ignore ShaderEnqueueAMDX, it's a beta extension.
	case spv::CapabilityGroupNonUniformRotateKHR:
		return features.shader_subgroup_rotate.shaderSubgroupRotate == VK_TRUE;
	case spv::CapabilityExpectAssumeKHR:
		return features.expect_assume.shaderExpectAssume == VK_TRUE;
	case spv::CapabilityFloatControls2:
		return features.shader_float_controls2.shaderFloatControls2 == VK_TRUE;
	case spv::CapabilityQuadControlKHR:
		return features.shader_quad_control.shaderQuadControl == VK_TRUE;
	case spv::CapabilityRawAccessChainsNV:
		return features.raw_access_chains_nv.shaderRawAccessChains == VK_TRUE;
	case spv::CapabilityReplicatedCompositesEXT:
		return features.shader_replicated_composites.shaderReplicatedComposites == VK_TRUE;

	default:
		LOGE("Unrecognized SPIR-V capability %u, treating as unsupported.\n", unsigned(cap));
		return false;
	}
}